

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall
complex_policy::escape<kiste::serializer_impl::serializer<html,complex_policy,ratio_policy>,double>
          (complex_policy *this,serializer<html,_complex_policy,_ratio_policy> *serializer,
          complex<double> *value)

{
  complex<double> *this_00;
  double local_30;
  double local_28;
  complex<double> *local_20;
  complex<double> *value_local;
  serializer<html,_complex_policy,_ratio_policy> *serializer_local;
  complex_policy *this_local;
  
  local_20 = value;
  value_local = (complex<double> *)serializer;
  serializer_local = (serializer<html,_complex_policy,_ratio_policy> *)this;
  local_28 = std::complex<double>::real_abi_cxx11_(value);
  kiste::serializer_impl::serializer<html,_complex_policy,_ratio_policy>::escape<double>
            (serializer,&local_28);
  kiste::serializer_impl::serializer<html,_complex_policy,_ratio_policy>::escape<char[4]>
            ((serializer<html,_complex_policy,_ratio_policy> *)value_local,(char (*) [4])" + ");
  this_00 = value_local;
  local_30 = std::complex<double>::imag_abi_cxx11_(local_20);
  kiste::serializer_impl::serializer<html,_complex_policy,_ratio_policy>::escape<double>
            ((serializer<html,_complex_policy,_ratio_policy> *)this_00,&local_30);
  kiste::serializer_impl::serializer<html,_complex_policy,_ratio_policy>::escape<char[5]>
            ((serializer<html,_complex_policy,_ratio_policy> *)value_local,(char (*) [5])" * i");
  return;
}

Assistant:

void escape(SerializerT& serializer, const std::complex<T>& value)
  {
    serializer.escape(value.real());
    serializer.escape(" + ");
    serializer.escape(value.imag());
    serializer.escape(" * i");
  }